

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu580.c
# Opt level: O3

MPP_RET hal_h264e_vepu580_ret_task(void *hal,HalEncTask *task)

{
  int *piVar1;
  undefined1 auVar2 [16];
  EncRcTask *pEVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  sbyte sVar10;
  long lVar11;
  RK_U32 RVar12;
  uint uVar13;
  int iVar14;
  RK_U32 RVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  RK_S32 madp_cnt_statistics [5];
  int local_48 [6];
  
  lVar18 = *(long *)((long)hal + 0x1a0);
  iVar16 = (task->flags).reg_idx;
  uVar19 = *(int *)(*(long *)((long)hal + 0x60) + 0x40) *
           *(int *)(*(long *)((long)hal + 0x60) + 0x3c);
  pEVar3 = task->rc_task;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter %p\n","hal_h264e_vepu580_ret_task",hal);
  }
  task->length = task->length + task->hw_length;
  iVar14 = task->hw_length << 3;
  (pEVar3->info).bit_real = iVar14;
  lVar18 = (long)iVar16 * 0x1cb8 + lVar18;
  uVar13 = 0;
  uVar7 = *(uint *)(lVar18 + 0x169c) / uVar19;
  (pEVar3->info).quality_real = uVar7;
  uVar8 = 0;
  uVar17 = *(uint *)(lVar18 + 0x17bc) & 0x7fffff;
  if (uVar17 != 0) {
    uVar8 = *(uint *)(lVar18 + 0x17b8) / uVar17;
  }
  (pEVar3->info).madi = uVar8;
  uVar8 = *(uint *)(lVar18 + 0x17b4) & 0x1fffff;
  if (uVar8 != 0) {
    uVar13 = *(uint *)(lVar18 + 0x17b0) / uVar8;
  }
  (pEVar3->info).madp = uVar13;
  uVar8 = (((*(uint *)(lVar18 + 0x17a4) & 0x1fffff) +
           (*(uint *)(lVar18 + 0x17a8) & 0x7fffff) + (*(uint *)(lVar18 + 0x17ac) & 0x7fffff)) *
          0x100) / uVar19;
  (pEVar3->info).iblk4_prop = uVar8;
  (pEVar3->info).sse = (ulong)*(uint6 *)(lVar18 + 0x1696);
  (pEVar3->info).lvl16_inter_num = *(uint *)(lVar18 + 0x1798) & 0x1fffff;
  (pEVar3->info).lvl8_inter_num = *(uint *)(lVar18 + 0x179c) & 0x7fffff;
  (pEVar3->info).lvl16_intra_num = *(uint *)(lVar18 + 0x17a4) & 0x1fffff;
  (pEVar3->info).lvl8_intra_num = *(uint *)(lVar18 + 0x17a8) & 0x7fffff;
  (pEVar3->info).lvl4_intra_num = *(uint *)(lVar18 + 0x17ac) & 0x7fffff;
  *(int *)((long)hal + 0xb0) = iVar14;
  *(uint *)((long)hal + 0xb4) = uVar7;
  *(uint *)((long)hal + 0xc0) = uVar8;
  (task->hal_ret).data = (void *)((long)hal + 0x90);
  (task->hal_ret).number = 1;
  lVar18 = *(long *)((long)hal + 0x1d0);
  uVar7 = ((uint)(*(int *)(lVar18 + 0x17c8) * 0x11 + *(int *)(lVar18 + 0x17cc) * 0x16 +
                 *(int *)(lVar18 + 0x17d0) * 0x18) >> 2) * 100;
  RVar12 = 100;
  if (uVar7 <= uVar19 * 5) {
    RVar12 = 0;
  }
  RVar15 = 200;
  if (uVar7 <= uVar19 * 0xf) {
    RVar15 = RVar12;
  }
  uVar7 = (((uint)(*(int *)(lVar18 + 0x17dc) * 5 + *(int *)(lVar18 + 0x17e0) * 6) >> 2) +
          *(int *)(lVar18 + 0x17d8)) * 100;
  RVar12 = 2;
  if (uVar7 <= uVar19 * 0x1e) {
    RVar12 = (RK_U32)(uVar19 * 0xd < uVar7);
  }
  (pEVar3->info).motion_level = RVar15;
  (pEVar3->info).complex_level = RVar12;
  if ((hal_h264e_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","motion_level %u, complex_level %u\n",
               "hal_h264e_vepu580_ret_task");
  }
  plVar4 = *(long **)((long)hal + 0x168);
  if (plVar4 == (long *)0x0) goto LAB_0022378f;
  pEVar3 = task->rc_task;
  iVar16 = *(int *)(*(long *)*plVar4 + 0x1864);
  *(uint *)((long)plVar4 + 0xc) = (uint)(iVar16 != 1);
  lVar9 = ((long *)*plVar4)[0x34];
  lVar11 = (long)(task->flags).reg_idx * 0x1cb8;
  lVar18 = lVar9 + lVar11;
  piVar1 = (int *)(lVar9 + 0x17c4 + lVar11);
  iVar14 = *piVar1;
  iVar5 = piVar1[1];
  uVar19 = piVar1[2];
  iVar6 = piVar1[3];
  lVar9 = 0;
  do {
    auVar2 = *(undefined1 (*) [16])(madp_num_map[0] + lVar9);
    *(int *)((long)local_48 + lVar9) =
         auVar2._12_4_ * iVar6 + auVar2._4_4_ * iVar5 +
         (int)((auVar2._8_8_ & 0xffffffff) * (ulong)uVar19) + auVar2._0_4_ * iVar14;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x14);
  uVar7 = 0;
  uVar19 = 0;
  uVar8 = *(uint *)(lVar18 + 0x17bc) & 0x7fffff;
  if (uVar8 != 0) {
    uVar19 = *(uint *)(lVar18 + 0x17b8) / uVar8;
  }
  *(uint *)((long)plVar4 + 100) = uVar19;
  (pEVar3->info).madi = uVar19;
  uVar19 = *(uint *)(lVar18 + 0x17b4) & 0x1fffff;
  if (uVar19 != 0) {
    uVar7 = *(uint *)(lVar18 + 0x17b0) / uVar19;
  }
  *(uint *)((long)plVar4 + 0x5c) = uVar7;
  (pEVar3->info).madp = uVar7;
  iVar14 = *(int *)(lVar18 + 0x17d8) + *(int *)(lVar18 + 0x17d4) + *(int *)(lVar18 + 0x17dc);
  iVar14 = iVar14 + *(int *)(lVar18 + 0x17e0) + (uint)(iVar14 + *(int *)(lVar18 + 0x17e0) == 0);
  if (local_48[4] == 0) {
    iVar16 = (int)plVar4[2] * 0xb + *(int *)((long)plVar4 + 0x14) * 8;
    iVar14 = 0x1c;
    uVar19 = 3;
  }
  else {
    sVar10 = (iVar16 != 1) * '\x05' + 10;
    uVar7 = (uint)(iVar16 != 1);
    lVar18 = 0;
    do {
      if (*(int *)((long)mb_avg_madp_thd + (ulong)(uVar7 * 0xc) + lVar18) <=
          *(int *)((long)plVar4 + 0x5c)) {
        uVar19 = 2;
        if ((((local_48[0] <=
               *(int *)((long)ctu_madp_cnt_thd[0] + lVar18 * 8 + (ulong)(uVar7 * 0x60)) * iVar14 >>
               sVar10) &&
             (local_48[1] <=
              *(int *)((ulong)(uVar7 * 0x60) + 0x2fa7d4 + lVar18 * 8) * iVar14 >> sVar10)) &&
            (local_48[2] <=
             *(int *)((ulong)(uVar7 * 0x60) + 0x2fa7d8 + lVar18 * 8) * iVar14 >> sVar10)) &&
           ((((local_48[0] <=
               *(int *)((ulong)(uVar7 * 0x60) + 0x2fa7dc + lVar18 * 8) * iVar14 >> sVar10 &&
              (local_48[1] <=
               *(int *)((ulong)(uVar7 * 0x60) + 0x2fa7e0 + lVar18 * 8) * iVar14 >> sVar10)) ||
             (*(int *)((ulong)(uVar7 * 0x60) + 0x2fa7e4 + lVar18 * 8) * iVar14 >> sVar10 <=
              local_48[3])) &&
            (*(int *)((ulong)(uVar7 * 0x60) + 0x2fa7e8 + lVar18 * 8) * iVar14 >> sVar10 <=
             local_48[3])))) {
          uVar19 = (uint)(local_48[3] <
                         iVar14 * *(int *)((ulong)(uVar7 * 0x60) + 0x2fa7ec + lVar18 * 8) >> sVar10)
          ;
        }
        goto LAB_002236c4;
      }
      lVar18 = lVar18 + 4;
    } while ((int)lVar18 != 0xc);
    uVar19 = 0;
LAB_002236c4:
    iVar16 = (int)plVar4[2] * 0xb + uVar19 * 0xd + *(int *)((long)plVar4 + 0x14) * 8;
    iVar14 = 0x29;
  }
  lVar18 = 0;
  do {
    iVar16 = iVar16 + *(int *)((long)plVar4 + lVar18 * 4 + 0x18) * 6;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 3);
  *(undefined4 *)(plVar4 + 1) = 0;
  if (*(int *)((long)plVar4 + 0x4c) == 0) {
    uVar7 = 0;
    if ((((int)plVar4[10] != 0) && (*(int *)((long)plVar4 + 0x54) != 0)) &&
       (uVar7 = 0, (int)plVar4[0xb] != 0)) {
LAB_00223742:
      uVar7 = (uint)(iVar14 <= iVar16);
      goto LAB_00223745;
    }
  }
  else if ((int)plVar4[10] == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 1;
    if (*(int *)((long)plVar4 + 0x54) == 0) goto LAB_00223742;
LAB_00223745:
    *(uint *)(plVar4 + 1) = uVar7;
  }
  if (local_48[4] != 0) {
    *(long *)((long)plVar4 + 0x14) = plVar4[2];
    *(long *)((long)plVar4 + 0x1c) = plVar4[3];
    *(uint *)(plVar4 + 2) = uVar19;
  }
  *(undefined4 *)(plVar4 + 0xb) = *(undefined4 *)((long)plVar4 + 0x54);
  plVar4[10] = *(long *)((long)plVar4 + 0x4c);
  *(uint *)((long)plVar4 + 0x4c) = (uint)(iVar14 <= iVar16);
  *(long *)((long)plVar4 + 0x3c) = plVar4[7];
  *(long *)((long)plVar4 + 0x44) = plVar4[8];
  *(uint *)(plVar4 + 7) = uVar7;
  *(undefined4 *)(plVar4 + 0xd) = *(undefined4 *)((long)plVar4 + 100);
  *(undefined4 *)(plVar4 + 0xc) = *(undefined4 *)((long)plVar4 + 0x5c);
LAB_0022378f:
  mpp_dev_multi_offset_reset(*(MppDevRegOffCfgs **)((long)hal + 0x38));
  if (*(H264eDpb **)((long)hal + 0x70) != (H264eDpb *)0x0) {
    h264e_dpb_hal_end(*(H264eDpb **)((long)hal + 0x70),(task->flags).curr_idx);
    h264e_dpb_hal_end(*(H264eDpb **)((long)hal + 0x70),(task->flags).refr_idx);
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave %p\n","hal_h264e_vepu580_ret_task",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu580_ret_task(void * hal, HalEncTask * task)
{
    HalH264eVepu580Ctx *ctx = (HalH264eVepu580Ctx *)hal;
    HalVepu580RegSet *regs = &ctx->regs_sets[task->flags.reg_idx];
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    RK_U32 mb_w = ctx->sps->pic_width_in_mbs;
    RK_U32 mb_h = ctx->sps->pic_height_in_mbs;
    RK_U32 mbs = mb_w * mb_h;

    hal_h264e_dbg_func("enter %p\n", hal);

    // update total hardware length
    task->length += task->hw_length;

    // setup bit length for rate control
    rc_info->bit_real = task->hw_length * 8;
    rc_info->quality_real = regs->reg_st.qp_sum / mbs;
    rc_info->madi = (!regs->reg_st.st_bnum_b16.num_b16) ? 0 :
                    regs->reg_st.madi /  regs->reg_st.st_bnum_b16.num_b16;
    rc_info->madp = (!regs->reg_st.st_bnum_cme.num_ctu) ? 0 :
                    regs->reg_st.madp / regs->reg_st.st_bnum_cme.num_ctu;
    rc_info->iblk4_prop = (regs->reg_st.st_pnum_i4.pnum_i4 +
                           regs->reg_st.st_pnum_i8.pnum_i8 +
                           regs->reg_st.st_pnum_i16.pnum_i16) * 256 / mbs;

    rc_info->sse = ((RK_S64)regs->reg_st.sse_h32 << 16) + (regs->reg_st.st_sse_bsl.sse_l16 & 0xffff);
    rc_info->lvl16_inter_num = regs->reg_st.st_pnum_p16.pnum_p16;
    rc_info->lvl8_inter_num  = regs->reg_st.st_pnum_p8.pnum_p8;
    rc_info->lvl16_intra_num = regs->reg_st.st_pnum_i16.pnum_i16;
    rc_info->lvl8_intra_num  = regs->reg_st.st_pnum_i8.pnum_i8;
    rc_info->lvl4_intra_num  = regs->reg_st.st_pnum_i4.pnum_i4;

    ctx->hal_rc_cfg.bit_real = rc_info->bit_real;
    ctx->hal_rc_cfg.quality_real = rc_info->quality_real;
    ctx->hal_rc_cfg.iblk4_prop = rc_info->iblk4_prop;

    task->hal_ret.data   = &ctx->hal_rc_cfg;
    task->hal_ret.number = 1;

    //RK_U32 madi_th_cnt0 = ctx->regs_set->reg_st.madi_b16num0;
    RK_U32 madi_th_cnt1 = ctx->regs_set->reg_st.madi_b16num1;
    RK_U32 madi_th_cnt2 = ctx->regs_set->reg_st.madi_b16num2;
    RK_U32 madi_th_cnt3 = ctx->regs_set->reg_st.madi_b16num3;
    //RK_U32 madp_th_cnt0 = ctx->regs_set->reg_st.md_sad_b16num0;
    RK_U32 madp_th_cnt1 = ctx->regs_set->reg_st.md_sad_b16num1;
    RK_U32 madp_th_cnt2 = ctx->regs_set->reg_st.md_sad_b16num2;
    RK_U32 madp_th_cnt3 = ctx->regs_set->reg_st.md_sad_b16num3;

    RK_U32 md_cnt = (24 * madp_th_cnt3 + 22 * madp_th_cnt2 + 17 * madp_th_cnt1) >> 2;
    RK_U32 madi_cnt = (6 * madi_th_cnt3 + 5 * madi_th_cnt2 + 4 * madi_th_cnt1) >> 2;

    rc_info->motion_level = 0;
    if (md_cnt * 100 > 15 * mbs)
        rc_info->motion_level = 200;
    else if (md_cnt * 100 > 5 * mbs)
        rc_info->motion_level = 100;
    else
        rc_info->motion_level = 0;

    rc_info->complex_level = 0;
    if (madi_cnt * 100 > 30 * mbs)
        rc_info->complex_level = 2;
    else if (madi_cnt * 100 > 13 * mbs)
        rc_info->complex_level = 1;
    else
        rc_info->complex_level = 0;

    hal_h264e_dbg_rc("motion_level %u, complex_level %u\n", rc_info->motion_level, rc_info->complex_level);

    vepu580_h264e_tune_stat_update(ctx->tune, task);

    mpp_dev_multi_offset_reset(ctx->offsets);

    if (ctx->dpb) {
        h264e_dpb_hal_end(ctx->dpb, task->flags.curr_idx);
        h264e_dpb_hal_end(ctx->dpb, task->flags.refr_idx);
    }

    hal_h264e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}